

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O2

int32_t peek(Env *env,uint32_t rel)

{
  State *pSVar1;
  uint uVar2;
  TSLexer *pTVar3;
  
  pSVar1 = env->state;
  uVar2 = (pSVar1->lookahead).offset + rel;
  if (uVar2 < (pSVar1->lookahead).size) {
    pTVar3 = (TSLexer *)((pSVar1->lookahead).contents + uVar2);
  }
  else {
    advance_before(env,rel);
    pTVar3 = env->lexer;
  }
  return pTVar3->lookahead;
}

Assistant:

static int32_t peek(Env *env, uint32_t rel) {
#ifdef TREE_SITTER_DEBUG
  debug_peek(env, rel);
#endif
  if (env->state->lookahead.offset + rel < env->state->lookahead.size) return unsafe_peek(env, rel);
  else {
    advance_before(env, rel);
    return PEEK;
  }
}